

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::SlotI1
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  uint32 local_34;
  RegSlot local_30;
  ProfileId local_2c;
  OpCode local_2a [3];
  ProfileId profileId_local;
  OpCode op_local;
  
  local_2c = profileId;
  local_2a[0] = op;
  CheckOpen(this);
  CheckOp(this,local_2a[0],(OpLayoutType)0x3d);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_2a[0]);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x694,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089fede;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089fede;
      *puVar3 = 0;
    }
    value_00 = FunctionBody::MapRegSlot(this->m_functionWrite,value);
    if (((local_2a[0] - 0x134 < 9) && ((0x141U >> (local_2a[0] - 0x134 & 0x1f) & 1) != 0)) ||
       (local_2a[0] == LdLocalSlot)) {
      bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if (!bVar2) {
        bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
        if (!bVar2) goto LAB_0089fdfe;
      }
      if (local_2c != 0xffff) {
        OpCodeUtil::ConvertNonCallOpToProfiled(local_2a);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x6a6,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (!bVar2) goto LAB_0089fede;
      *puVar3 = 0;
    }
LAB_0089fdfe:
    bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_2a[0],value_00,slotId);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,local_2a[0],value_00,slotId);
      if (!bVar2) {
        local_34 = slotId;
        local_30 = value_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_2a[0],this);
        Data::Write(&this->m_byteCodeData,&local_34,8);
      }
    }
    bVar2 = OpCodeAttr::IsProfiledOp(local_2a[0]);
    if (bVar2) {
      Data::Write(&this->m_byteCodeData,&local_2c,2);
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089fede:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::SlotI1(OpCode op, RegSlot value, uint32 slotId, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;
            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI1, op, value, slotId);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }